

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitGetLocal(WasmBytecodeGenerator *this)

{
  uint uVar1;
  WasmLocal WVar2;
  OpCodeAsmJs OVar3;
  uint32 uVar4;
  RegSlot location_;
  WasmReaderBase *pWVar5;
  WasmCompilationException *this_00;
  WasmRegisterSpace *this_01;
  RegSlot tmpReg;
  WasmRegisterSpace *regSpace;
  WasmType WStack_30;
  OpCodeAsmJs op;
  WasmLocal local;
  uint32 localIndex;
  WasmBytecodeGenerator *this_local;
  
  pWVar5 = GetReader(this);
  uVar1 = (pWVar5->m_currentNode).field_1.brTable.numTargets;
  uVar4 = WasmFunctionInfo::GetLocalCount(this->m_funcInfo);
  if (uVar4 <= uVar1) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_00,L"%u is not a valid local",(ulong)uVar1);
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  WVar2 = this->m_locals[uVar1];
  WStack_30 = WVar2.type;
  OVar3 = GetLoadOp(this,WStack_30);
  this_01 = GetRegisterSpace(this,WStack_30);
  location_ = WAsmJs::RegisterSpace::AcquireTmpRegister(this_01);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (this->m_writer,(ulong)OVar3,(ulong)location_,(ulong)WVar2 & 0xffffffff);
  EmitInfo::EmitInfo((EmitInfo *)&this_local,location_,&stack0xffffffffffffffd0);
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitGetLocal()
{
    uint32 localIndex = GetReader()->m_currentNode.var.num;
    if (m_funcInfo->GetLocalCount() <= localIndex)
    {
        throw WasmCompilationException(_u("%u is not a valid local"), localIndex);
    }

    WasmLocal local = m_locals[localIndex];

    Js::OpCodeAsmJs op = GetLoadOp(local.type);
    WasmRegisterSpace* regSpace = GetRegisterSpace(local.type);

    Js::RegSlot tmpReg = regSpace->AcquireTmpRegister();

    m_writer->AsmReg2(op, tmpReg, local.location);

    return EmitInfo(tmpReg, local.type);
}